

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_0::ProgramInputOutputReferencedByCase::iterate
          (ProgramInputOutputReferencedByCase *this)

{
  RenderContext *renderCtx;
  Program *programDefinition;
  int iVar1;
  deUint32 dVar2;
  ShaderType SVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar5;
  long lVar6;
  ShaderType SVar7;
  bool bVar8;
  bool bVar9;
  GLint value;
  GLenum prop;
  int local_2c8;
  GLint written;
  int local_2c0;
  Storage local_2bc;
  long local_2b8;
  Enum<int,_2UL> local_2b0;
  string targetResourceName;
  undefined1 local_280 [8];
  ostream local_278;
  ShaderProgram program;
  long lVar4;
  
  local_2bc = this->m_targetStorage;
  bVar8 = local_2bc == STORAGE_IN;
  bVar9 = local_2bc == STORAGE_PATCH_IN;
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar4 = CONCAT44(extraout_var,iVar1);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  generateProgramInterfaceProgramSources((ProgramSources *)local_280,this->m_program);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)local_280);
  glu::ProgramSources::~ProgramSources((ProgramSources *)local_280);
  pcVar5 = "shaderOutput";
  if (bVar8 || bVar9) {
    pcVar5 = "shaderInput";
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&targetResourceName,pcVar5,(allocator<char> *)local_280);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  programDefinition = this->m_program;
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  checkAndLogProgram(&program,programDefinition,(Functions *)CONCAT44(extraout_var_00,iVar1),
                     ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log);
  local_2c0 = 0x92e4 - (uint)(bVar8 || bVar9);
  local_2c8 = (**(code **)(lVar4 + 0x9a8))
                        (program.m_program.m_program,local_2c0,targetResourceName._M_dataplus._M_p);
  dVar2 = (**(code **)(lVar4 + 0x800))();
  glu::checkError(dVar2,"query resource index",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                  ,0xbe3);
  if (local_2c8 == -1) {
    local_280 = (undefined1  [8])
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_278);
    std::operator<<(&local_278,"Error, query for resource \"");
    std::operator<<(&local_278,(string *)&targetResourceName);
    std::operator<<(&local_278,"\" index returned invalid index.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_278);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_FAIL,
               "could not find target resource");
  }
  else {
    for (lVar6 = 8; lVar6 != 0x68; lVar6 = lVar6 + 0x10) {
      pcVar5 = *(char **)((long)&iterate::targetProps[0].propName + lVar6);
      if ((pcVar5 == (char *)0x0) ||
         (bVar8 = glu::ContextInfo::isExtensionSupported
                            (((this->super_TestCase).m_context)->m_contextInfo,pcVar5), bVar8)) {
        prop = *(GLenum *)((long)&PTR_typeinfo_01e54168 + lVar6);
        if ((local_2bc == STORAGE_PATCH_IN) || (local_2bc == STORAGE_IN)) {
          SVar7 = *(ShaderType *)((long)&PTR_typeinfo_01e54168 + lVar6 + 4);
          SVar3 = ProgramInterfaceDefinition::Program::getFirstStage(this->m_program);
        }
        else {
          SVar7 = *(ShaderType *)((long)&PTR_typeinfo_01e54168 + lVar6 + 4);
          SVar3 = ProgramInterfaceDefinition::Program::getLastStage(this->m_program);
        }
        written = -1;
        local_280 = (undefined1  [8])
                    ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_278);
        std::operator<<(&local_278,"Verifying ");
        pcVar5 = glu::getProgramResourcePropertyName(prop);
        std::operator<<(&local_278,pcVar5);
        std::operator<<(&local_278,", expecting ");
        pcVar5 = "TRUE";
        if (SVar7 != SVar3) {
          pcVar5 = "FALSE";
        }
        std::operator<<(&local_278,pcVar5);
        tcu::MessageBuilder::operator<<
                  ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_278);
        (**(code **)(lVar4 + 0x9c8))
                  (program.m_program.m_program,local_2c0,local_2c8,1,&prop,1,&written);
        dVar2 = (**(code **)(lVar4 + 0x800))();
        glu::checkError(dVar2,"query buffer binding",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fProgramInterfaceQueryTests.cpp"
                        ,0xbf9);
        if (written == 1) {
          local_280 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          local_2b8 = lVar6;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_278);
          pcVar5 = glu::getProgramResourcePropertyName(prop);
          std::operator<<(&local_278,pcVar5);
          std::operator<<(&local_278," = ");
          local_2b0.m_getName = glu::getBooleanName;
          local_2b0.m_value = -1;
          tcu::Format::Enum<int,_2UL>::toStream(&local_2b0,&local_278);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_278);
          lVar6 = local_2b8;
          if ((SVar7 == SVar3) == 0xffffffff) goto LAB_012f964f;
          local_280 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_278);
          std::operator<<(&local_278,"Error, got unexpected value");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_278);
          pcVar5 = "unexpected property value";
        }
        else {
          local_280 = (undefined1  [8])
                      ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_278);
          std::operator<<(&local_278,
                          "Error, query for referenced_by_* returned invalid number of values.");
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_280,(EndMessageToken *)&tcu::TestLog::EndMessage);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_278);
          pcVar5 = "property query failed";
        }
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,pcVar5);
      }
LAB_012f964f:
    }
  }
  std::__cxx11::string::~string((string *)&targetResourceName);
  glu::ShaderProgram::~ShaderProgram(&program);
  return STOP;
}

Assistant:

ProgramInputOutputReferencedByCase::IterateResult ProgramInputOutputReferencedByCase::iterate (void)
{
	static const struct
	{
		glw::GLenum		propName;
		glu::ShaderType	shaderType;
		const char*		extension;
	} targetProps[] =
	{
		{ GL_REFERENCED_BY_VERTEX_SHADER,			glu::SHADERTYPE_VERTEX,						DE_NULL							},
		{ GL_REFERENCED_BY_FRAGMENT_SHADER,			glu::SHADERTYPE_FRAGMENT,					DE_NULL							},
		{ GL_REFERENCED_BY_COMPUTE_SHADER,			glu::SHADERTYPE_COMPUTE,					DE_NULL							},
		{ GL_REFERENCED_BY_TESS_CONTROL_SHADER,		glu::SHADERTYPE_TESSELLATION_CONTROL,		"GL_EXT_tessellation_shader"	},
		{ GL_REFERENCED_BY_TESS_EVALUATION_SHADER,	glu::SHADERTYPE_TESSELLATION_EVALUATION,	"GL_EXT_tessellation_shader"	},
		{ GL_REFERENCED_BY_GEOMETRY_SHADER,			glu::SHADERTYPE_GEOMETRY,					"GL_EXT_geometry_shader"		},
	};

	const bool					isInputCase						= (m_targetStorage == glu::STORAGE_IN || m_targetStorage == glu::STORAGE_PATCH_IN);
	const glw::Functions&		gl								= m_context.getRenderContext().getFunctions();
	const glu::ShaderProgram	program							(m_context.getRenderContext(), generateProgramInterfaceProgramSources(m_program));
	const std::string			targetResourceName				= (isInputCase) ? ("shaderInput") : ("shaderOutput");
	const glw::GLenum			programGLInterface				= (isInputCase) ? (GL_PROGRAM_INPUT) : (GL_PROGRAM_OUTPUT);
	glw::GLuint					resourceIndex;

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	checkAndLogProgram(program, m_program, m_context.getRenderContext().getFunctions(), m_testCtx.getLog());

	// find target resource index

	resourceIndex = gl.getProgramResourceIndex(program.getProgram(), programGLInterface, targetResourceName.c_str());
	GLU_EXPECT_NO_ERROR(gl.getError(), "query resource index");

	if (resourceIndex == GL_INVALID_INDEX)
	{
		m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for resource \"" << targetResourceName << "\" index returned invalid index." << tcu::TestLog::EndMessage;
		m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "could not find target resource");
		return STOP;
	}

	// check props
	for (int propNdx = 0; propNdx < DE_LENGTH_OF_ARRAY(targetProps); ++propNdx)
	{
		if (targetProps[propNdx].extension == DE_NULL || m_context.getContextInfo().isExtensionSupported(targetProps[propNdx].extension))
		{
			const glw::GLenum	prop			= targetProps[propNdx].propName;
			const bool			expected		= (isInputCase) ? (targetProps[propNdx].shaderType == m_program->getFirstStage()) : (targetProps[propNdx].shaderType == m_program->getLastStage());
			glw::GLint			value			= -1;
			glw::GLint			written			= -1;

			m_testCtx.getLog() << tcu::TestLog::Message << "Verifying " << glu::getProgramResourcePropertyName(prop) << ", expecting " << ((expected) ? ("TRUE") : ("FALSE")) << tcu::TestLog::EndMessage;

			gl.getProgramResourceiv(program.getProgram(), programGLInterface, resourceIndex, 1, &prop, 1, &written, &value);
			GLU_EXPECT_NO_ERROR(gl.getError(), "query buffer binding");

			if (written != 1)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, query for referenced_by_* returned invalid number of values." << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "property query failed");
				continue;
			}

			m_testCtx.getLog() << tcu::TestLog::Message << glu::getProgramResourcePropertyName(prop) << " = " << glu::getBooleanStr(value) << tcu::TestLog::EndMessage;

			if (value != ((expected) ? (GL_TRUE) : (GL_FALSE)))
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Error, got unexpected value" << tcu::TestLog::EndMessage;
				m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "unexpected property value");
				continue;
			}
		}
	}

	return STOP;
}